

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O3

bool Speed(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  _Rb_tree_header *p_Var1;
  size_type sVar2;
  undefined4 uVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  int *piVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long lVar13;
  EVP_AEAD *pEVar14;
  EVP_MD *pEVar15;
  EVP_MD *md;
  TRUST_TOKEN_METHOD *pTVar16;
  char *pcVar17;
  _Alloc_hider __nptr;
  string selected;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  UniquePtr<RSA> key;
  uint8_t fake_sha256_hash [32];
  uint sig_len;
  TimeResults results;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args_map;
  char *ptr;
  undefined1 local_5e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b8;
  string local_5a8;
  _Any_data local_588;
  code *local_578;
  code *pcStack_570;
  string local_568;
  _Any_data local_548;
  code *local_538;
  code *local_530;
  _Any_data local_528;
  code *local_518;
  code *pcStack_510;
  _Any_data local_508;
  string local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  string local_4c8;
  string local_4a8;
  string local_488;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_468;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  key_type local_238 [16];
  
  p_Var1 = &local_468._M_impl.super__Rb_tree_header;
  local_468._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_468._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_468._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_468._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_468._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  bVar5 = ParseKeyValueArguments
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_468,args,kArguments);
  if (!bVar5) {
    PrintUsage(kArguments);
    bVar5 = false;
    goto LAB_00129fc3;
  }
  local_5e8._0_8_ = local_5e8 + 0x10;
  local_5e8._8_8_ = 0;
  local_5e8[0x10] = '\0';
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-filter","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&local_468,local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar9._M_node != p_Var1) {
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-filter","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_468,local_238);
    std::__cxx11::string::_M_assign((string *)local_5e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
    }
  }
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-json","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&local_468,local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar9._M_node != p_Var1) {
    g_print_json = '\x01';
  }
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-timeout","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&local_468,local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar9._M_node != p_Var1) {
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-timeout","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_468,local_238);
    iVar7 = atoi((pmVar10->_M_dataplus)._M_p);
    g_timeout_seconds = (uint64_t)iVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
    }
  }
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-threads","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&local_468,local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar9._M_node != p_Var1) {
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-threads","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_468,local_238);
    g_threads = atoi((pmVar10->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
    }
  }
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-chunks","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&local_468,local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar9._M_node != p_Var1) {
    if (g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
    }
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-chunks","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_468,local_238);
    __nptr._M_p = (pmVar10->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
    }
    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"-chunks","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_468,local_238);
    sVar2 = pmVar10->_M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
    }
    if (sVar2 != 0) {
      pcVar17 = __nptr._M_p + sVar2;
      piVar11 = __errno_location();
      do {
        *piVar11 = 0;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)strtoull(__nptr._M_p,(char **)local_238,10);
        _Var4._M_p = local_238[0]._M_dataplus._M_p;
        if ((local_238[0]._M_dataplus._M_p == __nptr._M_p) || (*piVar11 == 0x22)) {
LAB_00129edc:
          Speed();
          goto LAB_00129fa6;
        }
        local_5c8._M_allocated_capacity = (size_type)paVar12;
        if (g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&g_chunk_lengths,
                     (iterator)
                     g_chunk_lengths.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_5c8._M_allocated_capacity);
        }
        else {
          *g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish = (unsigned_long)paVar12;
          g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        __nptr._M_p = _Var4._M_p;
        if (_Var4._M_p != pcVar17) {
          if (*_Var4._M_p != ',') goto LAB_00129edc;
          __nptr._M_p = _Var4._M_p + 1;
        }
      } while (__nptr._M_p != pcVar17);
    }
  }
  if (g_print_json == '\x01') {
    puts("[");
  }
  if (local_5e8._8_8_ == 0) {
LAB_00128c57:
    if (SpeedRSA(std::__cxx11::string_const&)::kRSAKeys == '\0') {
      Speed();
    }
    local_4f8.field_2._M_allocated_capacity = 0;
    paVar12 = &local_5a8.field_2;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_5c8._M_local_buf,
                 (char *)(&SpeedRSA(std::__cxx11::string_const&)::kRSAKeys)
                         [local_4f8.field_2._M_allocated_capacity * 3],(allocator<char> *)local_238)
      ;
      local_568._M_dataplus._M_p =
           (pointer)RSA_private_key_from_bytes
                              (*(uint8_t **)
                                (&DAT_00304698 + local_4f8.field_2._M_allocated_capacity * 0x18),
                               *(size_t *)
                                (&DAT_003046a0 + local_4f8.field_2._M_allocated_capacity * 0x18));
      if ((RSA *)local_568._M_dataplus._M_p == (RSA *)0x0) {
        fprintf(_stderr,"Failed to parse %s key.\n",local_5c8._M_allocated_capacity);
        ERR_print_errors_fp(_stderr);
        Speed();
        goto LAB_00129fa6;
      }
      uVar8 = RSA_size((RSA *)local_568._M_dataplus._M_p);
      if (0x200 < uVar8) {
        abort();
      }
      local_4c8.field_2._M_allocated_capacity = 0;
      local_4c8.field_2._8_8_ = 0;
      local_4c8._M_dataplus._M_p = (pointer)0x0;
      local_4c8._M_string_length = 0;
      local_508._M_unused._M_object = &local_568;
      local_508._8_8_ = &local_4c8;
      local_4f8._M_string_length =
           (size_type)
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:333:41)>
           ::_M_invoke;
      local_4f8._M_dataplus._M_p =
           (pointer)std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:333:41)>
                    ::_M_manager;
      bVar5 = TimeFunctionParallel((TimeResults *)&local_488,(function<bool_()> *)&local_508);
      if ((code *)local_4f8._M_dataplus._M_p != (code *)0x0) {
        (*(code *)local_4f8._M_dataplus._M_p)(&local_508,&local_508,3);
      }
      if (!bVar5) {
        fwrite("RSA_sign failed.\n",0x11,1,_stderr);
        ERR_print_errors_fp(_stderr);
LAB_00129f7d:
        std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&local_568);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c8._M_allocated_capacity != &local_5b8) {
          operator_delete((void *)local_5c8._M_allocated_capacity,
                          local_5b8._M_allocated_capacity + 1);
        }
        goto LAB_00129fa6;
      }
      local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,local_5c8._M_allocated_capacity,
                 local_5c8._8_8_ + local_5c8._M_allocated_capacity);
      std::__cxx11::string::append((char *)local_238);
      TimeResults::Print((TimeResults *)&local_488,local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
        operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1
                       );
      }
      iVar7 = RSA_sign(0x2a0,(uchar *)&local_4c8,0x20,(uchar *)local_238,(uint *)&local_4a8,
                       (RSA *)local_568._M_dataplus._M_p);
      if (iVar7 == 0) goto LAB_00129f7d;
      uVar3 = local_4a8._M_dataplus._M_p._0_4_;
      local_528._M_unused._M_object = (void *)0x0;
      local_528._8_8_ = 0;
      local_518 = (code *)0x0;
      pcStack_510 = (code *)0x0;
      local_528._M_unused._M_object = operator_new(0x20);
      *(string **)local_528._M_unused._0_8_ = &local_568;
      *(string **)((long)local_528._M_unused._0_8_ + 8) = &local_4c8;
      *(key_type **)((long)local_528._M_unused._0_8_ + 0x10) = local_238;
      *(undefined4 *)((long)local_528._M_unused._0_8_ + 0x18) = uVar3;
      pcStack_510 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:355:23)>
                    ::_M_invoke;
      local_518 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:355:23)>
                  ::_M_manager;
      bVar5 = TimeFunctionParallel((TimeResults *)&local_488,(function<bool_()> *)&local_528);
      if (local_518 != (code *)0x0) {
        (*local_518)(&local_528,&local_528,3);
      }
      if (!bVar5) {
        Speed();
LAB_00129f6e:
        ERR_print_errors_fp(_stderr);
        goto LAB_00129f7d;
      }
      local_5a8._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5a8,local_5c8._M_allocated_capacity,
                 local_5c8._8_8_ + local_5c8._M_allocated_capacity);
      std::__cxx11::string::append((char *)&local_5a8);
      TimeResults::Print((TimeResults *)&local_488,&local_5a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != paVar12) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
      uVar3 = local_4a8._M_dataplus._M_p._0_4_;
      local_588._M_unused._M_object = (void *)0x0;
      local_588._8_8_ = 0;
      local_578 = (code *)0x0;
      pcStack_570 = (code *)0x0;
      local_588._M_unused._M_object = operator_new(0x20);
      *(string **)local_588._M_unused._0_8_ = &local_568;
      *(string **)((long)local_588._M_unused._0_8_ + 8) = &local_4c8;
      *(key_type **)((long)local_588._M_unused._0_8_ + 0x10) = local_238;
      *(undefined4 *)((long)local_588._M_unused._0_8_ + 0x18) = uVar3;
      pcStack_570 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:367:23)>
                    ::_M_invoke;
      local_578 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:367:23)>
                  ::_M_manager;
      bVar5 = TimeFunctionParallel((TimeResults *)&local_488,(function<bool_()> *)&local_588);
      if (local_578 != (code *)0x0) {
        (*local_578)(&local_588,&local_588,3);
      }
      if (!bVar5) {
        Speed();
        goto LAB_00129f6e;
      }
      local_5a8._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5a8,local_5c8._M_allocated_capacity,
                 local_5c8._8_8_ + local_5c8._M_allocated_capacity);
      std::__cxx11::string::append((char *)&local_5a8);
      TimeResults::Print((TimeResults *)&local_488,&local_5a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != paVar12) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
      local_548._8_8_ = 0;
      local_548._M_unused._M_object = &local_4f8.field_2;
      local_530 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:388:41)>
                  ::_M_invoke;
      local_538 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:388:41)>
                  ::_M_manager;
      bVar5 = TimeFunctionParallel((TimeResults *)&local_488,(function<bool_()> *)&local_548);
      if (local_538 != (code *)0x0) {
        (*local_538)(&local_548,&local_548,3);
      }
      if (!bVar5) {
        Speed();
        goto LAB_00129f6e;
      }
      local_5a8._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5a8,local_5c8._M_allocated_capacity,
                 local_5c8._8_8_ + local_5c8._M_allocated_capacity);
      std::__cxx11::string::append((char *)&local_5a8);
      TimeResults::Print((TimeResults *)&local_488,&local_5a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != paVar12) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
      std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&local_568);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._M_allocated_capacity != &local_5b8) {
        operator_delete((void *)local_5c8._M_allocated_capacity,local_5b8._M_allocated_capacity + 1)
        ;
      }
      local_4f8.field_2._M_allocated_capacity = local_4f8.field_2._M_allocated_capacity + 1;
    } while (local_4f8.field_2._M_allocated_capacity <
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3);
  }
  else {
    lVar13 = std::__cxx11::string::find(local_5e8,0x24b394,0);
    if (lVar13 != -1) goto LAB_00128c57;
  }
  pEVar14 = EVP_aead_aegis_128l();
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"AEGIS-128L","");
  bVar6 = SpeedAEAD(pEVar14,local_238,0xd,(string *)local_5e8._0_8_);
  bVar5 = true;
  if (bVar6) {
    pEVar14 = EVP_aead_aegis_128x2();
    local_5c8._M_allocated_capacity = (size_type)&local_5b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"AEGIS-128X2","");
    bVar6 = SpeedAEAD(pEVar14,(string *)&local_5c8,0xd,(string *)local_5e8._0_8_);
    bVar5 = true;
    if (bVar6) {
      pEVar14 = EVP_aead_aegis_256();
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"AEGIS-256","");
      bVar6 = SpeedAEAD(pEVar14,&local_4c8,0xd,(string *)local_5e8._0_8_);
      bVar5 = true;
      if (bVar6) {
        pEVar14 = EVP_aead_aes_128_gcm();
        local_508._M_unused._M_object = &local_4f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"AES-128-GCM","");
        bVar6 = SpeedAEAD(pEVar14,(string *)&local_508,0xd,(string *)local_5e8._0_8_);
        bVar5 = true;
        if (bVar6) {
          pEVar14 = EVP_aead_aes_256_gcm();
          local_528._M_unused._M_object = &local_518;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"AES-256-GCM","");
          bVar6 = SpeedAEAD(pEVar14,(string *)&local_528,0xd,(string *)local_5e8._0_8_);
          bVar5 = true;
          if (bVar6) {
            pEVar14 = EVP_aead_chacha20_poly1305();
            local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_5a8,"ChaCha20-Poly1305","");
            bVar6 = SpeedAEAD(pEVar14,&local_5a8,0xd,(string *)local_5e8._0_8_);
            bVar5 = true;
            if (bVar6) {
              pEVar14 = EVP_aead_des_ede3_cbc_sha1_tls();
              local_588._M_unused._M_object = &local_578;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_588,"DES-EDE3-CBC-SHA1","");
              bVar6 = SpeedAEAD(pEVar14,(string *)&local_588,0xb,(string *)local_5e8._0_8_);
              bVar5 = true;
              if (bVar6) {
                pEVar14 = EVP_aead_aes_128_cbc_sha1_tls();
                local_548._M_unused._M_object = &local_538;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_548,"AES-128-CBC-SHA1","");
                bVar6 = SpeedAEAD(pEVar14,(string *)&local_548,0xb,(string *)local_5e8._0_8_);
                bVar5 = true;
                if (bVar6) {
                  pEVar14 = EVP_aead_aes_256_cbc_sha1_tls();
                  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_488,"AES-256-CBC-SHA1","");
                  bVar6 = SpeedAEAD(pEVar14,&local_488,0xb,(string *)local_5e8._0_8_);
                  bVar5 = true;
                  if (bVar6) {
                    pEVar14 = EVP_aead_aes_128_cbc_sha1_tls();
                    local_4f8.field_2._M_allocated_capacity = (size_type)&local_4d8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_4f8.field_2,"AES-128-CBC-SHA1","");
                    bVar6 = SpeedAEADOpen(pEVar14,(string *)&local_4f8.field_2,0xb,
                                          (string *)local_5e8._0_8_);
                    bVar5 = true;
                    if (bVar6) {
                      pEVar14 = EVP_aead_aes_256_cbc_sha1_tls();
                      local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_568,"AES-256-CBC-SHA1","");
                      bVar6 = SpeedAEADOpen(pEVar14,&local_568,0xb,(string *)local_5e8._0_8_);
                      bVar5 = true;
                      if (bVar6) {
                        pEVar14 = EVP_aead_aes_128_gcm_siv();
                        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_4a8,"AES-128-GCM-SIV","");
                        bVar6 = SpeedAEAD(pEVar14,&local_4a8,0xd,(string *)local_5e8._0_8_);
                        bVar5 = true;
                        if (bVar6) {
                          pEVar14 = EVP_aead_aes_256_gcm_siv();
                          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_258,"AES-256-GCM-SIV","");
                          bVar6 = SpeedAEAD(pEVar14,&local_258,0xd,(string *)local_5e8._0_8_);
                          bVar5 = true;
                          if (bVar6) {
                            pEVar14 = EVP_aead_aes_128_gcm_siv();
                            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_278,"AES-128-GCM-SIV","");
                            bVar6 = SpeedAEADOpen(pEVar14,&local_278,0xd,(string *)local_5e8._0_8_);
                            bVar5 = true;
                            if (bVar6) {
                              pEVar14 = EVP_aead_aes_256_gcm_siv();
                              local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_298,"AES-256-GCM-SIV","");
                              bVar6 = SpeedAEADOpen(pEVar14,&local_298,0xd,(string *)local_5e8._0_8_
                                                   );
                              bVar5 = true;
                              if (bVar6) {
                                pEVar14 = EVP_aead_aes_128_ccm_bluetooth();
                                local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_2b8,"AES-128-CCM-Bluetooth","");
                                bVar6 = SpeedAEAD(pEVar14,&local_2b8,0xd,(string *)local_5e8._0_8_);
                                bVar5 = true;
                                if (bVar6) {
                                  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_2d8,"AES-128","");
                                  bVar6 = SpeedAESBlock(&local_2d8,0x80,(string *)local_5e8._0_8_);
                                  bVar5 = true;
                                  if (bVar6) {
                                    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_2f8,"AES-256","");
                                    bVar6 = SpeedAESBlock(&local_2f8,0x100,(string *)local_5e8._0_8_
                                                         );
                                    bVar5 = true;
                                    if (bVar6) {
                                      pEVar15 = EVP_sha1();
                                      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_318,"SHA-1","");
                                      bVar6 = SpeedHash((EVP_MD *)pEVar15,&local_318,
                                                        (string *)local_5e8._0_8_);
                                      bVar5 = true;
                                      if (bVar6) {
                                        pEVar15 = EVP_sha256();
                                        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_338,"SHA-256","");
                                        bVar6 = SpeedHash((EVP_MD *)pEVar15,&local_338,
                                                          (string *)local_5e8._0_8_);
                                        bVar5 = true;
                                        if (bVar6) {
                                          pEVar15 = EVP_sha512();
                                          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&local_358,"SHA-512","");
                                          bVar6 = SpeedHash((EVP_MD *)pEVar15,&local_358,
                                                            (string *)local_5e8._0_8_);
                                          bVar5 = true;
                                          if (bVar6) {
                                            md = EVP_blake2b256();
                                            local_378._M_dataplus._M_p = (pointer)&local_378.field_2
                                            ;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)&local_378,"BLAKE2b-256","");
                                            bVar6 = SpeedHash(md,&local_378,
                                                              (string *)local_5e8._0_8_);
                                            bVar5 = true;
                                            if (bVar6) {
                                              bVar6 = SpeedRandom((string *)local_5e8);
                                              if (bVar6) {
                                                bVar6 = SpeedECDH((string *)local_5e8);
                                                if (bVar6) {
                                                  bVar6 = SpeedECDSA((string *)local_5e8);
                                                  if (bVar6) {
                                                    bVar6 = Speed25519((string *)local_5e8);
                                                    if (bVar6) {
                                                      bVar6 = SpeedSPAKE2((string *)local_5e8);
                                                      if (bVar6) {
                                                        bVar6 = SpeedScrypt((string *)local_5e8);
                                                        if (bVar6) {
                                                          bVar6 = SpeedRSAKeyGen((string *)local_5e8
                                                                                );
                                                          if (bVar6) {
                                                            bVar6 = SpeedHRSS((string *)local_5e8);
                                                            if (bVar6) {
                                                              bVar6 = SpeedKyber((string *)local_5e8
                                                                                );
                                                              if (bVar6) {
                                                                bVar6 = SpeedMLDSA((string *)
                                                                                   local_5e8);
                                                                if (bVar6) {
                                                                  bVar6 = SpeedMLKEM((string *)
                                                                                     local_5e8);
                                                                  if (bVar6) {
                                                                    bVar6 = SpeedMLKEM1024((string *
                                                  )local_5e8);
                                                  if (bVar6) {
                                                    bVar6 = SpeedSLHDSA((string *)local_5e8);
                                                    if (bVar6) {
                                                      bVar6 = SpeedHashToCurve((string *)local_5e8);
                                                      if (bVar6) {
                                                        local_398._M_dataplus._M_p =
                                                             (pointer)&local_398.field_2;
                                                        std::__cxx11::string::
                                                        _M_construct<char_const*>
                                                                  ((string *)&local_398,
                                                                   "TrustToken-Exp1-Batch1","");
                                                        pTVar16 = TRUST_TOKEN_experiment_v1();
                                                        bVar6 = SpeedTrustToken(&local_398,pTVar16,1
                                                                                ,(string *)local_5e8
                                                                               );
                                                        bVar5 = true;
                                                        if (bVar6) {
                                                          local_3b8._M_dataplus._M_p =
                                                               (pointer)&local_3b8.field_2;
                                                          std::__cxx11::string::
                                                          _M_construct<char_const*>
                                                                    ((string *)&local_3b8,
                                                                     "TrustToken-Exp1-Batch10","");
                                                          pTVar16 = TRUST_TOKEN_experiment_v1();
                                                          bVar6 = SpeedTrustToken(&local_3b8,pTVar16
                                                                                  ,10,(string *)
                                                                                      local_5e8);
                                                          bVar5 = true;
                                                          if (bVar6) {
                                                            local_3d8._M_dataplus._M_p =
                                                                 (pointer)&local_3d8.field_2;
                                                            std::__cxx11::string::
                                                            _M_construct<char_const*>
                                                                      ((string *)&local_3d8,
                                                                       "TrustToken-Exp2VOPRF-Batch1"
                                                                       ,"");
                                                            pTVar16 = 
                                                  TRUST_TOKEN_experiment_v2_voprf();
                                                  bVar6 = SpeedTrustToken(&local_3d8,pTVar16,1,
                                                                          (string *)local_5e8);
                                                  bVar5 = true;
                                                  if (bVar6) {
                                                    local_3f8._M_dataplus._M_p =
                                                         (pointer)&local_3f8.field_2;
                                                    std::__cxx11::string::_M_construct<char_const*>
                                                              ((string *)&local_3f8,
                                                               "TrustToken-Exp2VOPRF-Batch10","");
                                                    pTVar16 = TRUST_TOKEN_experiment_v2_voprf();
                                                    bVar6 = SpeedTrustToken(&local_3f8,pTVar16,10,
                                                                            (string *)local_5e8);
                                                    bVar5 = true;
                                                    if (bVar6) {
                                                      local_418._M_dataplus._M_p =
                                                           (pointer)&local_418.field_2;
                                                      std::__cxx11::string::
                                                      _M_construct<char_const*>
                                                                ((string *)&local_418,
                                                                 "TrustToken-Exp2PMB-Batch1","");
                                                      pTVar16 = TRUST_TOKEN_experiment_v2_pmb();
                                                      bVar6 = SpeedTrustToken(&local_418,pTVar16,1,
                                                                              (string *)local_5e8);
                                                      bVar5 = true;
                                                      if (bVar6) {
                                                        local_438._M_dataplus._M_p =
                                                             (pointer)&local_438.field_2;
                                                        std::__cxx11::string::
                                                        _M_construct<char_const*>
                                                                  ((string *)&local_438,
                                                                   "TrustToken-Exp2PMB-Batch10","");
                                                        pTVar16 = TRUST_TOKEN_experiment_v2_pmb();
                                                        bVar6 = SpeedTrustToken(&local_438,pTVar16,
                                                                                10,(string *)
                                                                                   local_5e8);
                                                        bVar5 = true;
                                                        if (bVar6) {
                                                          bVar6 = SpeedBase64((string *)local_5e8);
                                                          if (bVar6) {
                                                            bVar5 = SpeedSipHash((string *)local_5e8
                                                                                );
                                                            bVar5 = !bVar5;
                                                          }
                                                        }
                                                        if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_438._M_dataplus._M_p != &local_438.field_2
                                                  ) {
                                                    operator_delete(local_438._M_dataplus._M_p,
                                                                    local_438.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_418._M_dataplus._M_p != &local_418.field_2
                                                  ) {
                                                    operator_delete(local_418._M_dataplus._M_p,
                                                                    local_418.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_3f8._M_dataplus._M_p != &local_3f8.field_2
                                                  ) {
                                                    operator_delete(local_3f8._M_dataplus._M_p,
                                                                    local_3f8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_3d8._M_dataplus._M_p != &local_3d8.field_2
                                                  ) {
                                                    operator_delete(local_3d8._M_dataplus._M_p,
                                                                    local_3d8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_3b8._M_dataplus._M_p != &local_3b8.field_2
                                                  ) {
                                                    operator_delete(local_3b8._M_dataplus._M_p,
                                                                    local_3b8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_398._M_dataplus._M_p != &local_398.field_2
                                                  ) {
                                                    operator_delete(local_398._M_dataplus._M_p,
                                                                    local_398.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_378._M_dataplus._M_p != &local_378.field_2)
                                            {
                                              operator_delete(local_378._M_dataplus._M_p,
                                                              local_378.field_2.
                                                              _M_allocated_capacity + 1);
                                            }
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_358._M_dataplus._M_p != &local_358.field_2) {
                                            operator_delete(local_358._M_dataplus._M_p,
                                                            local_358.field_2._M_allocated_capacity
                                                            + 1);
                                          }
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_338._M_dataplus._M_p != &local_338.field_2) {
                                          operator_delete(local_338._M_dataplus._M_p,
                                                          local_338.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_318._M_dataplus._M_p != &local_318.field_2) {
                                        operator_delete(local_318._M_dataplus._M_p,
                                                        local_318.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                                      operator_delete(local_2f8._M_dataplus._M_p,
                                                      local_2f8.field_2._M_allocated_capacity + 1);
                                    }
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                                    operator_delete(local_2d8._M_dataplus._M_p,
                                                    local_2d8.field_2._M_allocated_capacity + 1);
                                  }
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                                  operator_delete(local_2b8._M_dataplus._M_p,
                                                  local_2b8.field_2._M_allocated_capacity + 1);
                                }
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_298._M_dataplus._M_p != &local_298.field_2) {
                                operator_delete(local_298._M_dataplus._M_p,
                                                local_298.field_2._M_allocated_capacity + 1);
                              }
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
                              operator_delete(local_278._M_dataplus._M_p,
                                              local_278.field_2._M_allocated_capacity + 1);
                            }
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_258._M_dataplus._M_p != &local_258.field_2) {
                            operator_delete(local_258._M_dataplus._M_p,
                                            local_258.field_2._M_allocated_capacity + 1);
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
                          operator_delete(local_4a8._M_dataplus._M_p,
                                          local_4a8.field_2._M_allocated_capacity + 1);
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_568._M_dataplus._M_p != &local_568.field_2) {
                        operator_delete(local_568._M_dataplus._M_p,
                                        local_568.field_2._M_allocated_capacity + 1);
                      }
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4f8.field_2._M_allocated_capacity != &local_4d8) {
                      operator_delete((void *)local_4f8.field_2._M_allocated_capacity,
                                      local_4d8._M_allocated_capacity + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_488._M_dataplus._M_p != &local_488.field_2) {
                    operator_delete(local_488._M_dataplus._M_p,
                                    local_488.field_2._M_allocated_capacity + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_548._M_unused._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&local_538) {
                  operator_delete(local_548._M_unused._M_object,(ulong)((long)local_538 + 1));
                }
              }
              if ((code **)local_588._M_unused._0_8_ != &local_578) {
                operator_delete(local_588._M_unused._M_object,(ulong)(local_578 + 1));
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
              operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((code **)local_528._M_unused._0_8_ != &local_518) {
            operator_delete(local_528._M_unused._M_object,(ulong)(local_518 + 1));
          }
        }
        if ((string *)local_508._M_unused._0_8_ != &local_4f8) {
          operator_delete(local_508._M_unused._M_object,(ulong)(local_4f8._M_dataplus._M_p + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._M_allocated_capacity != &local_5b8) {
      operator_delete((void *)local_5c8._M_allocated_capacity,local_5b8._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
LAB_00129fa6:
    bVar5 = false;
  }
  else {
    bVar5 = true;
    if (g_print_json == '\x01') {
      puts("\n]");
    }
  }
  if ((string *)local_5e8._0_8_ != (string *)(local_5e8 + 0x10)) {
    operator_delete((void *)local_5e8._0_8_,CONCAT71(local_5e8._17_7_,local_5e8[0x10]) + 1);
  }
LAB_00129fc3:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_468);
  return bVar5;
}

Assistant:

bool Speed(const std::vector<std::string> &args) {
  std::map<std::string, std::string> args_map;
  if (!ParseKeyValueArguments(&args_map, args, kArguments)) {
    PrintUsage(kArguments);
    return false;
  }

  std::string selected;
  if (args_map.count("-filter") != 0) {
    selected = args_map["-filter"];
  }

  if (args_map.count("-json") != 0) {
    g_print_json = true;
  }

  if (args_map.count("-timeout") != 0) {
    g_timeout_seconds = atoi(args_map["-timeout"].c_str());
  }

#if defined(OPENSSL_THREADS)
  if (args_map.count("-threads") != 0) {
    g_threads = atoi(args_map["-threads"].c_str());
  }
#endif

  if (args_map.count("-chunks") != 0) {
    g_chunk_lengths.clear();
    const char *start = args_map["-chunks"].data();
    const char *end = start + args_map["-chunks"].size();
    while (start != end) {
      errno = 0;
      char *ptr;
      unsigned long long val = strtoull(start, &ptr, 10);
      if (ptr == start /* no numeric characters found */ ||
          errno == ERANGE /* overflow */ || static_cast<size_t>(val) != val) {
        fprintf(stderr, "Error parsing -chunks argument\n");
        return false;
      }
      g_chunk_lengths.push_back(static_cast<size_t>(val));
      start = ptr;
      if (start != end) {
        if (*start != ',') {
          fprintf(stderr, "Error parsing -chunks argument\n");
          return false;
        }
        start++;
      }
    }
  }

  // kTLSADLen is the number of bytes of additional data that TLS passes to
  // AEADs.
  static const size_t kTLSADLen = 13;
  // kLegacyADLen is the number of bytes that TLS passes to the "legacy" AEADs.
  // These are AEADs that weren't originally defined as AEADs, but which we use
  // via the AEAD interface. In order for that to work, they have some TLS
  // knowledge in them and construct a couple of the AD bytes internally.
  static const size_t kLegacyADLen = kTLSADLen - 2;

  if (g_print_json) {
    puts("[");
  }
  if (!SpeedRSA(selected) ||
      !SpeedAEAD(EVP_aead_aegis_128l(), "AEGIS-128L", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aegis_128x2(), "AEGIS-128X2", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aegis_256(), "AEGIS-256", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_128_gcm(), "AES-128-GCM", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_256_gcm(), "AES-256-GCM", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_chacha20_poly1305(), "ChaCha20-Poly1305", kTLSADLen,
                 selected) ||
      !SpeedAEAD(EVP_aead_des_ede3_cbc_sha1_tls(), "DES-EDE3-CBC-SHA1",
                 kLegacyADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_128_cbc_sha1_tls(), "AES-128-CBC-SHA1",
                 kLegacyADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_256_cbc_sha1_tls(), "AES-256-CBC-SHA1",
                 kLegacyADLen, selected) ||
      !SpeedAEADOpen(EVP_aead_aes_128_cbc_sha1_tls(), "AES-128-CBC-SHA1",
                     kLegacyADLen, selected) ||
      !SpeedAEADOpen(EVP_aead_aes_256_cbc_sha1_tls(), "AES-256-CBC-SHA1",
                     kLegacyADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_128_gcm_siv(), "AES-128-GCM-SIV", kTLSADLen,
                 selected) ||
      !SpeedAEAD(EVP_aead_aes_256_gcm_siv(), "AES-256-GCM-SIV", kTLSADLen,
                 selected) ||
      !SpeedAEADOpen(EVP_aead_aes_128_gcm_siv(), "AES-128-GCM-SIV", kTLSADLen,
                     selected) ||
      !SpeedAEADOpen(EVP_aead_aes_256_gcm_siv(), "AES-256-GCM-SIV", kTLSADLen,
                     selected) ||
      !SpeedAEAD(EVP_aead_aes_128_ccm_bluetooth(), "AES-128-CCM-Bluetooth",
                 kTLSADLen, selected) ||
      !SpeedAESBlock("AES-128", 128, selected) ||
      !SpeedAESBlock("AES-256", 256, selected) ||
      !SpeedHash(EVP_sha1(), "SHA-1", selected) ||
      !SpeedHash(EVP_sha256(), "SHA-256", selected) ||
      !SpeedHash(EVP_sha512(), "SHA-512", selected) ||
      !SpeedHash(EVP_blake2b256(), "BLAKE2b-256", selected) ||
      !SpeedRandom(selected) ||       //
      !SpeedECDH(selected) ||         //
      !SpeedECDSA(selected) ||        //
      !Speed25519(selected) ||        //
      !SpeedSPAKE2(selected) ||       //
      !SpeedScrypt(selected) ||       //
      !SpeedRSAKeyGen(selected) ||    //
      !SpeedHRSS(selected) ||         //
      !SpeedKyber(selected) ||        //
      !SpeedMLDSA(selected) ||        //
      !SpeedMLKEM(selected) ||        //
      !SpeedMLKEM1024(selected) ||    //
      !SpeedSLHDSA(selected) ||       //
      !SpeedHashToCurve(selected) ||  //
      !SpeedTrustToken("TrustToken-Exp1-Batch1", TRUST_TOKEN_experiment_v1(), 1,
                       selected) ||
      !SpeedTrustToken("TrustToken-Exp1-Batch10", TRUST_TOKEN_experiment_v1(),
                       10, selected) ||
      !SpeedTrustToken("TrustToken-Exp2VOPRF-Batch1",
                       TRUST_TOKEN_experiment_v2_voprf(), 1, selected) ||
      !SpeedTrustToken("TrustToken-Exp2VOPRF-Batch10",
                       TRUST_TOKEN_experiment_v2_voprf(), 10, selected) ||
      !SpeedTrustToken("TrustToken-Exp2PMB-Batch1",
                       TRUST_TOKEN_experiment_v2_pmb(), 1, selected) ||
      !SpeedTrustToken("TrustToken-Exp2PMB-Batch10",
                       TRUST_TOKEN_experiment_v2_pmb(), 10, selected) ||
      !SpeedBase64(selected) ||  //
      !SpeedSipHash(selected)) {
    return false;
  }
#if defined(BORINGSSL_FIPS)
  if (!SpeedSelfTest(selected)) {
    return false;
  }
#endif
  if (g_print_json) {
    puts("\n]");
  }

  return true;
}